

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpOneProperty(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  ostream *poVar2;
  cmDocumentation *this_00;
  string pname;
  
  std::__cxx11::string::string((string *)&stack0xffffffffffffffc0,(string *)&this->CurrentArgument);
  cmSystemTools::HelpFileName((string *)&stack0xffffffffffffffa0,(string *)&stack0xffffffffffffffc0)
  ;
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  this_00 = (cmDocumentation *)&stack0xffffffffffffff80;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00,
                 "prop_*/",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xffffffffffffffa0);
  bVar1 = PrintFiles(this_00,os,(string *)&stack0xffffffffffffff80);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff80);
  if (!bVar1) {
    poVar2 = std::operator<<(os,"Argument \"");
    poVar2 = std::operator<<(poVar2,(string *)&this->CurrentArgument);
    poVar2 = std::operator<<(poVar2,"\" to --help-property is not a CMake property.  ");
    std::operator<<(poVar2,"Use --help-property-list to see all properties.\n");
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffa0);
  return bVar1;
}

Assistant:

bool cmDocumentation::PrintHelpOneProperty(std::ostream& os)
{
  std::string pname = cmSystemTools::HelpFileName(this->CurrentArgument);
  if(this->PrintFiles(os, "prop_*/" + pname))
    {
    return true;
    }
  // Argument was not a property.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-property is not a CMake property.  "
     << "Use --help-property-list to see all properties.\n";
  return false;
}